

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_EmplaceSingle_Test::TestBody
          (ParallelFlatHashSet_EmplaceSingle_Test *this)

{
  initializer_list<int> iVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_408;
  Message local_400;
  int local_3f8;
  key_arg<int> local_3f4;
  size_t local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_3;
  Message local_3d0;
  int local_3c8;
  key_arg<int> local_3c4;
  size_t local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_2;
  Message local_3a0;
  int local_398;
  key_arg<int> local_394;
  size_t local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  Message local_370;
  int local_368;
  key_arg<int> local_364;
  size_t local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar;
  key_arg<int> local_340 [2];
  int i;
  allocator<int> local_32b;
  key_equal local_32a;
  hasher local_329;
  int local_328 [2];
  iterator local_320;
  size_type local_318;
  undefined1 local_310 [8];
  Set m;
  ParallelFlatHashSet_EmplaceSingle_Test *this_local;
  
  local_328[0] = 1;
  local_328[1] = 0xb;
  local_320 = local_328;
  local_318 = 2;
  m.
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       )(_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
         )this;
  std::allocator<int>::allocator(&local_32b);
  iVar1._M_len = local_318;
  iVar1._M_array = local_320;
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
                       *)local_310,iVar1,0,&local_329,&local_32a,&local_32b);
  std::allocator<int>::~allocator(&local_32b);
  for (local_340[0] = 0; local_340[0] < 0xc; local_340[0] = local_340[0] + 1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = local_340[0];
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
    ::
    emplace_single<int,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_EmplaceSingle_Test::TestBody()::__0>
              ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
                *)local_310,local_340,
               (anon_class_4_1_54a39809 *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 4));
  }
  local_364 = 0;
  local_360 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                            *)local_310,&local_364);
  local_368 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_358,"m.count(0)","1",&local_360,&local_368);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message(&local_370);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_394 = 1;
  local_390 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                            *)local_310,&local_394);
  local_398 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_388,"m.count(1)","0",&local_390,&local_398);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_3a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_3c4 = 2;
  local_3c0 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                            *)local_310,&local_3c4);
  local_3c8 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b8,"m.count(2)","1",&local_3c0,&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar2) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3f4 = 0xb;
  local_3f0 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                            *)local_310,&local_3f4);
  local_3f8 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e8,"m.count(11)","0",&local_3f0,&local_3f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message(&local_400);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
              *)local_310);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, EmplaceSingle) {
    using Set = phmap::THIS_HASH_SET<int>;

    // --------------------
    // test emplace_single
    // --------------------
    Set m = { 1, 11 };
 
    // emplace_single insert a value if not already present, else removes it
    for (int i=0; i<12; ++i)
        m.emplace_single(i, [i](const Set::constructor& ctor) { ctor(i); });
    EXPECT_EQ(m.count(0), 1);
    EXPECT_EQ(m.count(1), 0);
    EXPECT_EQ(m.count(2), 1);
    EXPECT_EQ(m.count(11), 0);
}